

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deltatimes.cpp
# Opt level: O1

void extractDeltaTimesForAllNotes
               (MidiFile *midifile,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *histogram,Options *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  MidiEventList *pMVar10;
  MidiEvent *pMVar11;
  ostream *poVar12;
  mapped_type *pmVar13;
  int index;
  double dVar14;
  stringstream key;
  bool local_203;
  double local_200;
  key_type local_1f0;
  double local_1d0;
  double local_1c8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_1c0;
  string local_1b8 [4];
  ios_base local_138 [264];
  
  local_1c0 = histogram;
  iVar7 = smf::MidiFile::getTicksPerQuarterNote(midifile);
  paVar1 = &local_1b8[0].field_2;
  local_1b8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"all","");
  bVar4 = smf::Options::getBoolean(options,local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8[0]._M_dataplus._M_p);
  }
  local_1b8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"seconds","");
  bVar5 = smf::Options::getBoolean(options,local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8[0]._M_dataplus._M_p);
  }
  if (bVar5) {
    local_203 = true;
    bVar5 = false;
    bVar3 = false;
  }
  else {
    local_1b8[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"milliseconds","");
    bVar5 = smf::Options::getBoolean(options,local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8[0]._M_dataplus._M_p);
    }
    if (bVar5) {
      local_203 = true;
      bVar5 = false;
      bVar3 = true;
    }
    else {
      local_1b8[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"quarters","");
      bVar5 = smf::Options::getBoolean(options,local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1b8[0]._M_dataplus._M_p);
      }
      bVar3 = false;
      local_203 = bVar4;
    }
  }
  local_1b8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"count","");
  bVar6 = smf::Options::getBoolean(options,local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8[0]._M_dataplus._M_p);
  }
  if (local_203 != false) {
    smf::MidiFile::doTimeAnalysis(midifile);
  }
  iVar8 = smf::MidiFile::getTrackCount(midifile);
  if (0 < iVar8) {
    local_1c8 = (double)iVar7;
    local_1d0 = local_1c8;
    if (bVar5 == false) {
      local_1d0 = 1.0;
    }
    iVar7 = 0;
    do {
      pMVar10 = smf::MidiFile::operator[](midifile,iVar7);
      iVar8 = smf::MidiEventList::getEventCount(pMVar10);
      if (0 < iVar8) {
        iVar8 = -1;
        index = 0;
        do {
          pMVar10 = smf::MidiFile::operator[](midifile,iVar7);
          pMVar11 = smf::MidiEventList::operator[](pMVar10,index);
          bVar5 = smf::MidiMessage::isNote(&pMVar11->super_MidiMessage);
          iVar9 = iVar8;
          if ((bVar5) && (iVar9 = index, -1 < iVar8)) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
            if (bVar4) {
              std::__cxx11::stringbuf::str();
              local_1f0._M_string_length = 0;
              *local_1f0._M_dataplus._M_p = '\0';
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                operator_delete(local_1f0._M_dataplus._M_p);
              }
              pMVar10 = smf::MidiFile::operator[](midifile,iVar7);
              pMVar11 = smf::MidiEventList::operator[](pMVar10,index);
              iVar2 = pMVar11->tick;
              pMVar10 = smf::MidiFile::operator[](midifile,iVar7);
              pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar8);
              dVar14 = (double)(iVar2 - pMVar11->tick);
              poVar12 = std::ostream::_M_insert<double>(dVar14);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t",1);
              poVar12 = std::ostream::_M_insert<double>(dVar14 / local_1c8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t",1);
              pMVar10 = smf::MidiFile::operator[](midifile,iVar7);
              pMVar11 = smf::MidiEventList::operator[](pMVar10,index);
              local_200 = pMVar11->seconds;
              pMVar10 = smf::MidiFile::operator[](midifile,iVar7);
              pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar8);
              local_200 = local_200 - pMVar11->seconds;
              poVar12 = std::ostream::_M_insert<double>(local_200);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t",1);
              local_200 = local_200 * 1000.0;
            }
            else if (local_203 == false) {
              pMVar10 = smf::MidiFile::operator[](midifile,iVar7);
              pMVar11 = smf::MidiEventList::operator[](pMVar10,index);
              iVar2 = pMVar11->tick;
              pMVar10 = smf::MidiFile::operator[](midifile,iVar7);
              pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar8);
              iVar8 = pMVar11->tick;
              std::__cxx11::stringbuf::str();
              local_1f0._M_string_length = 0;
              *local_1f0._M_dataplus._M_p = '\0';
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                operator_delete(local_1f0._M_dataplus._M_p);
              }
              local_200 = (double)(iVar2 - iVar8) / local_1d0;
            }
            else {
              pMVar10 = smf::MidiFile::operator[](midifile,iVar7);
              pMVar11 = smf::MidiEventList::operator[](pMVar10,index);
              dVar14 = pMVar11->seconds;
              pMVar10 = smf::MidiFile::operator[](midifile,iVar7);
              pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar8);
              dVar14 = dVar14 - pMVar11->seconds;
              local_200 = dVar14 * 1000.0;
              if (!bVar3) {
                local_200 = dVar14;
              }
              std::__cxx11::stringbuf::str();
              local_1f0._M_string_length = 0;
              *local_1f0._M_dataplus._M_p = '\0';
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                operator_delete(local_1f0._M_dataplus._M_p);
              }
            }
            std::ostream::_M_insert<double>(local_200);
            if (bVar6) {
              std::__cxx11::stringbuf::str();
              pmVar13 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::operator[](local_1c0,&local_1f0);
              *pmVar13 = *pmVar13 + 1;
            }
            else {
              std::__cxx11::stringbuf::str();
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,local_1f0._M_dataplus._M_p,
                                   local_1f0._M_string_length);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
              std::ostream::put((char)poVar12);
              std::ostream::flush();
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p);
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
            std::ios_base::~ios_base(local_138);
          }
          iVar8 = iVar9;
          index = index + 1;
          pMVar10 = smf::MidiFile::operator[](midifile,iVar7);
          iVar9 = smf::MidiEventList::getEventCount(pMVar10);
        } while (index < iVar9);
      }
      iVar7 = iVar7 + 1;
      iVar8 = smf::MidiFile::getTrackCount(midifile);
    } while (iVar7 < iVar8);
  }
  return;
}

Assistant:

void extractDeltaTimesForAllNotes(MidiFile& midifile, map<string, int>& histogram,
		Options& options) {
	int tpq = midifile.getTicksPerQuarterNote();
	int timeFormat = TIME_TICKS;
	bool realtimeQ  = false;
	bool allQ = options.getBoolean("all");
	int lastindex = -1;
	if (allQ) {
		realtimeQ = true;
	}
	if (options.getBoolean("seconds")) {
		timeFormat = TIME_SECONDS;
		realtimeQ  = true;
	} else if (options.getBoolean("milliseconds")) {
		timeFormat = TIME_MILLISECONDS;
		realtimeQ  = true;
	} else if (options.getBoolean("quarters")) {
		timeFormat = TIME_QUARTERS;
	}
	bool histogramQ = options.getBoolean("count");

	if (realtimeQ) {
		midifile.doTimeAnalysis();
	}

	for (int i=0; i<midifile.getTrackCount(); i++) {
		lastindex = -1;
		for (int j=0; j<midifile[i].getEventCount(); j++) {
			if (!midifile[i][j].isNote()) {
				continue;
			}
			if (lastindex < 0) {
				lastindex = j;
				continue;
			}
			double value;
			stringstream key;
			if (allQ) {
				key.str().clear();
				value = midifile[i][j].tick - midifile[i][lastindex].tick;
				key << value << "\t";         // MIDI ticks
				key << value/tpq << "\t";     // quarter notes
				value = midifile[i][j].seconds - midifile[i][lastindex].seconds;
				key << value << "\t";         // seconds
				key << value * 1000.0;        // milliseconds
			} else if (realtimeQ) {
				value = midifile[i][j].seconds - midifile[i][lastindex].seconds;
				if (timeFormat == TIME_MILLISECONDS) {
					value *= 1000.0;
				}
				key.str().clear();
				key << value;
			} else {
				value = midifile[i][j].tick - midifile[i][lastindex].tick;
				if (timeFormat == TIME_QUARTERS) {
					value /= tpq;
				}
				key.str().clear();
				key << value;
			}
			if (histogramQ) {
				histogram[key.str()]++;
			} else {
				cout << key.str() << endl;
			}
			lastindex = j;
		}
	}
}